

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::to_string_abi_cxx11_(lest *this,char *txt)

{
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [34];
  byte local_8e;
  byte local_8d;
  byte local_7a;
  allocator local_79;
  string local_78 [32];
  lest local_58 [32];
  string local_38 [32];
  char *local_18;
  char *txt_local;
  
  local_7a = 0;
  local_8d = 0;
  local_8e = 0;
  local_18 = txt;
  txt_local = (char *)this;
  if (txt == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"{null string}",&local_d1);
    std::__cxx11::string::string(local_b0,local_d0);
    std::__cxx11::string::string(local_38,local_b0);
  }
  else {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string(local_78,txt,&local_79);
    local_8d = 1;
    make_strg_string(local_58,(string *)local_78);
    local_8e = 1;
    std::__cxx11::string::string(local_38,(string *)local_58);
  }
  std::__cxx11::string::string((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  if (txt == (char *)0x0) {
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  if ((local_8e & 1) != 0) {
    std::__cxx11::string::~string((string *)local_58);
  }
  if ((local_8d & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  return this;
}

Assistant:

inline std::string to_string( char    const * const   txt ) { return txt ? make_strg_string( txt ) : "{null string}"; }